

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDVertex * __thiscall ON_SubDHeap::VertexFromId(ON_SubDHeap *this,uint vertex_id)

{
  ON_SubDVertex *pOVar1;
  
  if ((((1 < vertex_id + 1) &&
       (pOVar1 = (ON_SubDVertex *)
                 ON_FixedSizePool::ElementFromId(&this->m_fspv,m_offset_vertex_id,vertex_id),
       pOVar1 != (ON_SubDVertex *)0x0)) && ((pOVar1->super_ON_SubDComponentBase).m_id == vertex_id))
     && ((pOVar1->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
    return pOVar1;
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

const class ON_SubDVertex* ON_SubDHeap::VertexFromId(
  unsigned int vertex_id
  ) const
{
  if ( 0 == vertex_id || ON_UNSET_UINT_INDEX == vertex_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const class ON_SubDVertex* vertex = (const class ON_SubDVertex*)m_fspv.ElementFromId(ON_SubDHeap::m_offset_vertex_id,vertex_id);
  if ( nullptr == vertex || vertex_id != vertex->m_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( ON_UNSET_UINT_INDEX == vertex->ArchiveId() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  return vertex;
}